

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AcceptanceTests>::TestInfo::
~TestInfo(TestInfo *this)

{
  pointer pcVar1;
  TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase> *pTVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pcVar1 = (this->code_location).file._M_dataplus._M_p;
  paVar3 = &(this->code_location).file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pTVar2 = (this->test_meta_factory)._M_t.
           super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase>,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase>_>_>
           .
           super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase>_*,_false>
           ._M_head_impl;
  if (pTVar2 != (TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase> *)0x0) {
    (*pTVar2->_vptr_TestMetaFactoryBase[1])();
  }
  (this->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase>,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase>_*,_false>
  ._M_head_impl = (TestMetaFactoryBase<(anonymous_namespace)::CcsTestCase> *)0x0;
  pcVar1 = (this->test_base_name)._M_dataplus._M_p;
  paVar3 = &(this->test_base_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->test_suite_base_name)._M_dataplus._M_p;
  paVar3 = &(this->test_suite_base_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

TestInfo(const char* a_test_suite_base_name, const char* a_test_base_name,
             TestMetaFactoryBase<ParamType>* a_test_meta_factory,
             CodeLocation a_code_location)
        : test_suite_base_name(a_test_suite_base_name),
          test_base_name(a_test_base_name),
          test_meta_factory(a_test_meta_factory),
          code_location(a_code_location) {}